

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_join.cpp
# Opt level: O1

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateStatistics
          (StatisticsPropagator *this,LogicalPositionalJoin *join,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  pointer *this_01;
  __buckets_ptr pp_Var1;
  ulong uVar2;
  pointer pNVar3;
  type pNVar4;
  reference pvVar5;
  pointer pLVar6;
  iterator iVar7;
  pointer pBVar8;
  __buckets_ptr pp_Var9;
  ulong uVar10;
  ColumnBinding *binding;
  ClientContext *pCVar11;
  key_type *__k;
  size_type __n;
  pointer pLVar12;
  vector<duckdb::ColumnBinding,_true> left_bindings;
  vector<duckdb::ColumnBinding,_true> right_bindings;
  ClientContext *local_68;
  ClientContext *local_60;
  __buckets_ptr local_50;
  key_type *local_48;
  __node_base local_40;
  
  this_00 = (vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             *)(node_ptr + 2);
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[](this_00,0);
  PropagateStatistics((StatisticsPropagator *)&local_68,
                      (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)join);
  pCVar11 = local_68;
  local_68 = (ClientContext *)0x0;
  pLVar12 = (join->super_LogicalUnconditionalJoin).super_LogicalOperator.types.
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (join->super_LogicalUnconditionalJoin).super_LogicalOperator.types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar11;
  if (pLVar12 != (pointer)0x0) {
    operator_delete(pLVar12);
  }
  if (local_68 != (ClientContext *)0x0) {
    operator_delete(local_68);
  }
  this_01 = &(join->super_LogicalUnconditionalJoin).super_LogicalOperator.types.
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  if (8 < (ulong)((long)node_ptr[3].
                        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl -
                 (long)node_ptr[2].
                       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)) {
    __n = 1;
    do {
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
      ::operator[](this_00,__n);
      PropagateStatistics((StatisticsPropagator *)&local_68,
                          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)join);
      pLVar12 = (join->super_LogicalUnconditionalJoin).super_LogicalOperator.types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_68 == (ClientContext *)0x0) {
LAB_00c99411:
        *this_01 = (pointer)0x0;
        if (pLVar12 != (pointer)0x0) {
          operator_delete(pLVar12);
        }
      }
      else if (pLVar12 != (pointer)0x0) {
        pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                 ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                               *)this_01);
        if (pNVar3->has_estimated_cardinality == true) {
          pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                   ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                 *)&local_68);
          if (pNVar3->has_estimated_cardinality == true) {
            pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                     ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                   *)this_01);
            if (pNVar3->has_max_cardinality == true) {
              pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                       ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                     *)&local_68);
              if (pNVar3->has_max_cardinality != false) {
                pNVar4 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                         ::operator*((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                      *)&local_68);
                pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                         ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                       *)this_01);
                if ((pNVar3->has_estimated_cardinality == true) &&
                   (pNVar4->has_estimated_cardinality == true)) {
                  pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                           ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                         *)this_01);
                  if ((pNVar3->has_max_cardinality == true) &&
                     (pNVar4->has_max_cardinality != false)) {
                    pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                             ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                           *)this_01);
                    pp_Var1 = (__buckets_ptr)pNVar3->estimated_cardinality;
                    local_50 = (__buckets_ptr)pNVar4->estimated_cardinality;
                    pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                             ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                           *)this_01);
                    pp_Var9 = local_50;
                    if (local_50 < pp_Var1) {
                      pp_Var9 = pp_Var1;
                    }
                    pNVar3->estimated_cardinality = (idx_t)pp_Var9;
                    pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                             ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                           *)this_01);
                    uVar2 = pNVar3->max_cardinality;
                    uVar10 = pNVar4->max_cardinality;
                    pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                             ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                           *)this_01);
                    if (uVar10 < uVar2) {
                      uVar10 = uVar2;
                    }
                    pNVar3->max_cardinality = uVar10;
                    goto LAB_00c99422;
                  }
                }
              }
            }
          }
        }
        pLVar12 = *this_01;
        goto LAB_00c99411;
      }
LAB_00c99422:
      if (local_68 != (ClientContext *)0x0) {
        operator_delete(local_68);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)node_ptr[3].
                                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                 _M_head_impl -
                           (long)node_ptr[2].
                                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                 _M_head_impl >> 3));
  }
  pvVar5 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar5);
  (*pLVar6->_vptr_LogicalOperator[2])(&local_68,pLVar6);
  if (local_68 != local_60) {
    pCVar11 = local_68;
    do {
      iVar7 = ::std::
              _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&(join->super_LogicalUnconditionalJoin).super_LogicalOperator.children.
                         super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(key_type *)pCVar11);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pBVar8 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                 ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                               *)((long)iVar7.
                                        super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                                        ._M_cur + 0x18));
        BaseStatistics::Set(pBVar8,CAN_HAVE_NULL_VALUES);
      }
      pCVar11 = (ClientContext *)&pCVar11->db;
    } while (pCVar11 != local_60);
  }
  pvVar5 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,1);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar5);
  (*pLVar6->_vptr_LogicalOperator[2])(&local_48,pLVar6);
  if (local_48 != (key_type *)local_40._M_nxt) {
    __k = local_48;
    do {
      iVar7 = ::std::
              _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&(join->super_LogicalUnconditionalJoin).super_LogicalOperator.children.
                         super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__k);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pBVar8 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                 ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                               *)((long)iVar7.
                                        super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                                        ._M_cur + 0x18));
        BaseStatistics::Set(pBVar8,CAN_HAVE_NULL_VALUES);
      }
      __k = __k + 1;
    } while (__k != (key_type *)local_40._M_nxt);
  }
  this->optimizer = (Optimizer *)*this_01;
  *this_01 = (pointer)0x0;
  if (local_48 != (key_type *)0x0) {
    operator_delete(local_48);
  }
  if (local_68 != (ClientContext *)0x0) {
    operator_delete(local_68);
  }
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)this;
}

Assistant:

unique_ptr<NodeStatistics> StatisticsPropagator::PropagateStatistics(LogicalPositionalJoin &join,
                                                                     unique_ptr<LogicalOperator> &node_ptr) {
	D_ASSERT(join.type == LogicalOperatorType::LOGICAL_POSITIONAL_JOIN);

	// first propagate through the children of the join
	node_stats = PropagateStatistics(join.children[0]);
	for (idx_t child_idx = 1; child_idx < join.children.size(); child_idx++) {
		auto child_stats = PropagateStatistics(join.children[child_idx]);
		if (!child_stats) {
			node_stats = nullptr;
		} else if (node_stats) {
			if (!node_stats->has_estimated_cardinality || !child_stats->has_estimated_cardinality ||
			    !node_stats->has_max_cardinality || !child_stats->has_max_cardinality) {
				node_stats = nullptr;
			} else {
				MaxCardinalities(node_stats, *child_stats);
			}
		}
	}

	// No conditions.

	// Positional Joins are always FULL OUTER

	// set IsNull() to true for all lhs statistics
	auto left_bindings = join.children[0]->GetColumnBindings();
	for (auto &binding : left_bindings) {
		auto stats = statistics_map.find(binding);
		if (stats != statistics_map.end()) {
			stats->second->Set(StatsInfo::CAN_HAVE_NULL_VALUES);
		}
	}

	// set IsNull() to true for all rhs statistics
	auto right_bindings = join.children[1]->GetColumnBindings();
	for (auto &binding : right_bindings) {
		auto stats = statistics_map.find(binding);
		if (stats != statistics_map.end()) {
			stats->second->Set(StatsInfo::CAN_HAVE_NULL_VALUES);
		}
	}

	return std::move(node_stats);
}